

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

seed_t lest::seed(text *opt,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  seed_t sVar4;
  long lVar5;
  time_t tVar6;
  runtime_error *this;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50 [2];
  char local_40 [16];
  
  iVar3 = std::__cxx11::string::compare((char *)arg);
  if (iVar3 == 0) {
    tVar6 = time((time_t *)0x0);
    sVar4 = (seed_t)tVar6;
  }
  else {
    pcVar2 = (arg->_M_dataplus)._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar2,pcVar2 + arg->_M_string_length);
    paVar1 = &local_f0.field_2;
    local_f0.field_2._M_allocated_capacity = 0x3736353433323130;
    local_f0.field_2._8_2_ = 0x3938;
    local_f0._M_string_length = 10;
    local_f0.field_2._M_local_buf[10] = '\0';
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    lVar5 = std::__cxx11::string::find_first_of((char *)local_d0,(ulong)paVar1,0);
    if (lVar5 == -1) {
      bVar7 = false;
    }
    else {
      lVar5 = std::__cxx11::string::find_first_not_of
                        ((char *)local_d0,(ulong)local_f0._M_dataplus._M_p,0);
      bVar7 = lVar5 == -1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (!bVar7) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"expecting \'time\' or positive number with option \'",opt);
      std::operator+(&local_90,&local_b0,"\', got \'");
      std::operator+(&local_70,&local_90,arg);
      std::operator+(&local_f0,&local_70,"\' (try option --help)");
      std::runtime_error::runtime_error(this,(string *)&local_f0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (arg->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + arg->_M_string_length);
    lVar5 = strtol(local_50[0],(char **)0x0,10);
    sVar4 = (seed_t)lVar5;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return sVar4;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}